

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error
ft_stroke_border_get_counts
          (SW_FT_StrokeBorder border,SW_FT_UInt *anum_points,SW_FT_UInt *anum_contours)

{
  bool bVar1;
  SW_FT_Int in_contour;
  SW_FT_Byte *tags;
  SW_FT_Vector *point;
  SW_FT_UInt count;
  SW_FT_UInt num_contours;
  SW_FT_UInt num_points;
  SW_FT_Error error;
  SW_FT_UInt *anum_contours_local;
  SW_FT_UInt *anum_points_local;
  SW_FT_StrokeBorder border_local;
  
  num_points = 0;
  num_contours = 0;
  tags = border->tags;
  bVar1 = false;
  for (count = border->num_points; count != 0; count = count - 1) {
    if ((*tags & 4) == 0) {
      if (!bVar1) goto LAB_0010f86e;
    }
    else {
      if (bVar1) goto LAB_0010f86e;
      bVar1 = true;
    }
    if ((*tags & 8) != 0) {
      bVar1 = false;
      num_contours = num_contours + 1;
    }
    num_points = num_points + 1;
    tags = tags + 1;
  }
  if (bVar1) {
LAB_0010f86e:
    num_points = 0;
    num_contours = 0;
  }
  else {
    border->valid = '\x01';
  }
  *anum_points = num_points;
  *anum_contours = num_contours;
  return 0;
}

Assistant:

static SW_FT_Error ft_stroke_border_get_counts(SW_FT_StrokeBorder border,
                                               SW_FT_UInt*        anum_points,
                                               SW_FT_UInt*        anum_contours)
{
    SW_FT_Error error = 0;
    SW_FT_UInt  num_points = 0;
    SW_FT_UInt  num_contours = 0;

    SW_FT_UInt    count = border->num_points;
    SW_FT_Vector* point = border->points;
    SW_FT_Byte*   tags = border->tags;
    SW_FT_Int     in_contour = 0;

    for (; count > 0; count--, num_points++, point++, tags++) {
        if (tags[0] & SW_FT_STROKE_TAG_BEGIN) {
            if (in_contour != 0) goto Fail;

            in_contour = 1;
        } else if (in_contour == 0)
            goto Fail;

        if (tags[0] & SW_FT_STROKE_TAG_END) {
            in_contour = 0;
            num_contours++;
        }
    }

    if (in_contour != 0) goto Fail;

    border->valid = TRUE;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;

Fail:
    num_points = 0;
    num_contours = 0;
    goto Exit;
}